

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QRect __thiscall QAccessibleTabButton::rect(QAccessibleTabButton *this)

{
  long lVar1;
  ulong uVar2;
  QRect *this_00;
  QTabBar *in_RDI;
  long in_FS_OFFSET;
  QPoint tp;
  QRect rec;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffb4;
  undefined8 local_38;
  undefined8 local_30;
  QRect local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (**(code **)(*(long *)&in_RDI->super_QWidget + 0x10))();
  if ((uVar2 & 1) == 0) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  }
  else {
    this_00 = (QRect *)QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6f58);
    QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    QWidget::mapToGlobal
              ((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (QPoint *)this_00);
    QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6fa5);
    QTabBar::tabRect(in_RDI,in_stack_ffffffffffffffb4);
    QPoint::x((QPoint *)0x7d6fc9);
    QRect::x((QRect *)0x7d6fd7);
    QPoint::y((QPoint *)0x7d6fed);
    QRect::y((QRect *)0x7d6ffb);
    QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QRect::QRect(this_00,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    local_18._8_8_ = local_30;
    local_18._0_8_ = local_38;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QRect rect() const override {
        if (!isValid())
            return QRect();

        QPoint tp = m_parent->mapToGlobal(QPoint(0,0));
        QRect rec = m_parent->tabRect(m_index);
        rec = QRect(tp.x() + rec.x(), tp.y() + rec.y(), rec.width(), rec.height());
        return rec;
    }